

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O1

void __thiscall fasttext::Vector::addVector(Vector *this,Vector *source,real s)

{
  size_t sVar1;
  float *pfVar2;
  float *pfVar3;
  size_t sVar4;
  
  sVar1 = (this->data_).size_;
  if (sVar1 == (source->data_).size_) {
    if (0 < (long)sVar1) {
      pfVar2 = (source->data_).mem_;
      pfVar3 = (this->data_).mem_;
      sVar4 = 0;
      do {
        pfVar3[sVar4] = pfVar2[sVar4] * s + pfVar3[sVar4];
        sVar4 = sVar4 + 1;
      } while (sVar1 != sVar4);
    }
    return;
  }
  __assert_fail("size() == source.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/olegtarasov[P]fastText/src/vector.cc"
                ,0x30,"void fasttext::Vector::addVector(const Vector &, real)");
}

Assistant:

void Vector::addVector(const Vector& source, real s) {
  assert(size() == source.size());
  for (int64_t i = 0; i < size(); i++) {
    data_[i] += s * source.data_[i];
  }
}